

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

int __thiscall ReadData::ReadGPSEph(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  ushort uVar1;
  int MessageLength;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  unsigned_short *Message;
  double dVar6;
  
  iVar4 = 6;
  if ((this->Head).MessageID == 7) {
    iVar4 = socketdata->pos;
    MessageLength = (this->Head).MessageLength;
    if (socketdata->len - iVar4 < MessageLength) {
      socketdata->pos = iVar4 + -0x1c;
      iVar4 = 2;
    }
    else {
      iVar2 = (int)((long)MessageLength + 4U);
      iVar5 = -1;
      if (-5 < MessageLength) {
        iVar5 = iVar2;
      }
      Message = (unsigned_short *)operator_new__((long)iVar5);
      memcpy(Message,socketdata->buff + iVar4,(long)MessageLength + 4U);
      socketdata->pos = iVar4 + iVar2;
      bVar3 = CRCCheck(HeadBuff,(uchar *)Message,MessageLength,MessageLength);
      if (bVar3) {
        uVar1 = *Message - 1;
        iVar4 = 4;
        if (uVar1 < 0x21) {
          this->GPSEph[uVar1].PRN = *Message;
          this->GPSEph[uVar1].sys = GPS;
          this->GPSEph[uVar1].HealthStatus = *(int *)(Message + 6);
          this->GPSEph[uVar1].RefTime.Week = *(int *)(Message + 0xc);
          this->GPSEph[uVar1].RefTime.SOW = *(double *)(Message + 0x10);
          this->GPSEph[uVar1].deltaN = *(double *)(Message + 0x18);
          this->GPSEph[uVar1].M0 = *(double *)(Message + 0x1c);
          dVar6 = *(double *)(Message + 0x14);
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          this->GPSEph[uVar1].sqrtA = dVar6;
          this->GPSEph[uVar1].ecc = *(double *)(Message + 0x20);
          this->GPSEph[uVar1].w = *(double *)(Message + 0x24);
          this->GPSEph[uVar1].cuc = *(double *)(Message + 0x28);
          this->GPSEph[uVar1].cus = *(double *)(Message + 0x2c);
          this->GPSEph[uVar1].crc = *(double *)(Message + 0x30);
          this->GPSEph[uVar1].crs = *(double *)(Message + 0x34);
          this->GPSEph[uVar1].cic = *(double *)(Message + 0x38);
          this->GPSEph[uVar1].cis = *(double *)(Message + 0x3c);
          this->GPSEph[uVar1].I0 = *(double *)(Message + 0x40);
          this->GPSEph[uVar1].I0Rate = *(double *)(Message + 0x44);
          this->GPSEph[uVar1].omegaO = *(double *)(Message + 0x48);
          this->GPSEph[uVar1].omegaORate = *(double *)(Message + 0x4c);
          this->GPSEph[uVar1].iodc = (long)*(int *)(Message + 0x50);
          this->GPSEph[uVar1].toc = *(double *)(Message + 0x52);
          this->GPSEph[uVar1].tgd = *(double *)(Message + 0x56);
          this->GPSEph[uVar1].af0 = *(double *)(Message + 0x5a);
          this->GPSEph[uVar1].af1 = *(double *)(Message + 0x5e);
          this->GPSEph[uVar1].af2 = *(double *)(Message + 0x62);
          this->GPSEph[uVar1].URA = *(double *)(Message + 0x6c);
          operator_delete__(Message);
          iVar4 = 0;
        }
      }
      else {
        operator_delete__(Message);
        iVar4 = 3;
      }
    }
  }
  return iVar4;
}

Assistant:

int ReadData::ReadGPSEph(BUFF &socketdata, unsigned char* HeadBuff)
{
    if(this->Head.MessageID != 7)
        return CONFLICT_ID;

    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        // reset(socketdata, pos);
        return FILE_OR_BUFF_END;
    }
    char* buff = new char [Head.MessageLength + 4];
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    try
    {
        if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)) {
            delete[] buff;
            return CRC_FAILED;
        }
        unsigned short int prn = U2I((unsigned char*)buff, 4) - 1;
        // cout << prn << endl;
        if(prn < 0 || prn > MAXGPSSRN)
            return INVALID_PRN;
        this->GPSEph[prn].PRN = prn + 1;
        this->GPSEph[prn].sys = GPS;

        this->GPSEph[prn].HealthStatus = U2I((unsigned char*)(buff + 12), 4);
        this->GPSEph[prn].RefTime.Week = U2I((unsigned char*)(buff + 24), 4);
        this->GPSEph[prn].RefTime.SOW = C2D(buff + 32, 8);
        this->GPSEph[prn].deltaN = C2D(buff + 48, 8);
        this->GPSEph[prn].M0 = C2D((buff + 56), 8);
        this->GPSEph[prn].sqrtA = sqrt(C2D(buff + 40, 8));
        this->GPSEph[prn].ecc = C2D(buff + 64, 8);
        this->GPSEph[prn].w = C2D(buff + 72, 8);
        this->GPSEph[prn].cuc = C2D(buff + 80, 8);
        this->GPSEph[prn].cus = C2D(buff + 88, 8);
        this->GPSEph[prn].crc = C2D(buff + 96, 8);
        this->GPSEph[prn].crs = C2D(buff + 104, 8);
        this->GPSEph[prn].cic = C2D(buff + 112, 8);
        this->GPSEph[prn].cis = C2D(buff + 120, 8);
        this->GPSEph[prn].I0 = C2D(buff + 128, 8);
        this->GPSEph[prn].I0Rate = C2D(buff + 136, 8);
        this->GPSEph[prn].omegaO = C2D(buff + 144, 8);
        this->GPSEph[prn].omegaORate  = C2D(buff + 152, 8);
        this->GPSEph[prn].iodc = U2I((unsigned char*)buff + 160, 4);
        this->GPSEph[prn].toc = C2D(buff + 164, 8);
        this->GPSEph[prn].tgd = C2D(buff + 172, 8);
        this->GPSEph[prn].af0 = C2D(buff + 180, 8);
        this->GPSEph[prn].af1 = C2D(buff + 188, 8);
        this->GPSEph[prn].af2 = C2D(buff + 196, 8);
        this->GPSEph[prn].URA = C2D(buff + 216, 8);
        // cout << setprecision(15) << GPSEph[prn].omega << endl;
    }
    catch(...)
    {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;

    return 0;
}